

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_arrays(void)

{
  uint32_t uVar1;
  int iVar2;
  ptrdiff_t pVar3;
  char *pcVar4;
  char *d;
  ptrdiff_t sz;
  char *local_d8;
  char *d2_8;
  char *d1_8;
  char *local_c0;
  char *d2_7;
  char *d1_7;
  char *local_a8;
  char *d2_6;
  char *d1_6;
  char *local_90;
  char *d2_5;
  char *d1_5;
  char *local_78;
  char *d2_4;
  char *d1_4;
  char *local_60;
  char *d2_3;
  char *d1_3;
  char *local_48;
  char *d2_2;
  char *d1_2;
  char *local_30;
  char *d2_1;
  char *d1_1;
  char *local_18;
  char *d2;
  char *d1;
  
  _plan(0x3f,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n");
  d2 = mp_encode_array(data,0);
  local_18 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "mp_check_array(0) == 0");
  uVar1 = mp_decode_array(&local_18);
  _ok((uint)(uVar1 == 0),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "mp_decode(mp_encode(0)) == 0");
  _ok((uint)((long)d2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "len(mp_encode_array(0)");
  _ok((uint)(d2 == local_18),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "len(mp_decode_array(0))");
  uVar1 = mp_sizeof_array(0);
  _ok((uint)(uVar1 == 1),"mp_sizeof_array(0) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "mp_sizeof_array(0)");
  iVar2 = memcmp(data,anon_var_dwarf_6917,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x90\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x189,
      "mp_encode(0) == \"\\x90\"");
  d2_1 = mp_encode_array(data,1);
  local_30 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 1");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "mp_check_array(1) == 0");
  uVar1 = mp_decode_array(&local_30);
  _ok((uint)(uVar1 == 1),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "mp_decode(mp_encode(1)) == 1");
  _ok((uint)((long)d2_1 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "len(mp_encode_array(1)");
  _ok((uint)(d2_1 == local_30),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "len(mp_decode_array(1))");
  uVar1 = mp_sizeof_array(1);
  _ok((uint)(uVar1 == 1),"mp_sizeof_array(1) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "mp_sizeof_array(1)");
  iVar2 = memcmp(data,anon_var_dwarf_3d1,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x91\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18a,
      "mp_encode(1) == \"\\x91\"");
  d2_2 = mp_encode_array(data,0xf);
  local_48 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 15");
  d1_3._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "mp_check_array(15) == 0");
  uVar1 = mp_decode_array(&local_48);
  _ok((uint)(uVar1 == 0xf),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (15)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "mp_decode(mp_encode(15)) == 15");
  _ok((uint)((long)d2_2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "len(mp_encode_array(15)");
  _ok((uint)(d2_2 == local_48),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "len(mp_decode_array(15))");
  uVar1 = mp_sizeof_array(0xf);
  _ok((uint)(uVar1 == 1),"mp_sizeof_array(15) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "mp_sizeof_array(15)");
  iVar2 = memcmp(data,anon_var_dwarf_6a13,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x9f\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18b,
      "mp_encode(15) == \"\\x9f\"");
  d2_3 = mp_encode_array(data,0x10);
  local_60 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 16");
  d1_4._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_3);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "mp_check_array(16) == 0");
  uVar1 = mp_decode_array(&local_60);
  _ok((uint)(uVar1 == 0x10),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (16)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "mp_decode(mp_encode(16)) == 16");
  _ok((uint)((long)d2_3 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "len(mp_encode_array(16)");
  _ok((uint)(d2_3 == local_60),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "len(mp_decode_array(16))");
  uVar1 = mp_sizeof_array(0x10);
  _ok((uint)(uVar1 == 3),"mp_sizeof_array(16) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "mp_sizeof_array(16)");
  iVar2 = memcmp(data,anon_var_dwarf_6a97,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdc\\x00\\x10\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18c,
      "mp_encode(16) == \"\\xdc\\x00\\x10\"");
  d2_4 = mp_encode_array(data,0xfffe);
  local_78 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0xfffe");
  d1_5._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_4);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "mp_check_array(0xfffe) == 0");
  uVar1 = mp_decode_array(&local_78);
  _ok((uint)(uVar1 == 0xfffe),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "mp_decode(mp_encode(0xfffe)) == 0xfffe");
  _ok((uint)((long)d2_4 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "len(mp_encode_array(0xfffe)");
  _ok((uint)(d2_4 == local_78),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "len(mp_decode_array(0xfffe))");
  uVar1 = mp_sizeof_array(0xfffe);
  _ok((uint)(uVar1 == 3),"mp_sizeof_array(0xfffe) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "mp_sizeof_array(0xfffe)");
  iVar2 = memcmp(data,anon_var_dwarf_6b1b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdc\\xff\\xfe\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18d,
      "mp_encode(0xfffe) == \"\\xdc\\xff\\xfe\"");
  d2_5 = mp_encode_array(data,0xffff);
  local_90 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0xffff");
  d1_6._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_5);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "mp_check_array(0xffff) == 0");
  uVar1 = mp_decode_array(&local_90);
  _ok((uint)(uVar1 == 0xffff),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "mp_decode(mp_encode(0xffff)) == 0xffff");
  _ok((uint)((long)d2_5 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "len(mp_encode_array(0xffff)");
  _ok((uint)(d2_5 == local_90),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "len(mp_decode_array(0xffff))");
  uVar1 = mp_sizeof_array(0xffff);
  _ok((uint)(uVar1 == 3),"mp_sizeof_array(0xffff) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "mp_sizeof_array(0xffff)");
  iVar2 = memcmp(data,anon_var_dwarf_6b9f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x18e,
      "mp_encode(0xffff) == \"\\xdc\\xff\\xff\"");
  d2_6 = mp_encode_array(data,0x10000);
  local_a8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0x10000");
  d1_7._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_6);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "mp_check_array(0x10000) == 0");
  uVar1 = mp_decode_array(&local_a8);
  _ok((uint)(uVar1 == 0x10000),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0x10000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "mp_decode(mp_encode(0x10000)) == 0x10000");
  _ok((uint)((long)d2_6 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "len(mp_encode_array(0x10000)");
  _ok((uint)(d2_6 == local_a8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "len(mp_decode_array(0x10000))");
  uVar1 = mp_sizeof_array(0x10000);
  _ok((uint)(uVar1 == 5),"mp_sizeof_array(0x10000) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "mp_sizeof_array(0x10000)");
  iVar2 = memcmp(data,anon_var_dwarf_6c23,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdd\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",399,
      "mp_encode(0x10000) == \"\\xdd\\x00\\x01\\x00\\x00\"");
  d2_7 = mp_encode_array(data,0xfffffffe);
  local_c0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0xfffffffeU");
  d1_8._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_7);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "mp_check_array(0xfffffffeU) == 0");
  uVar1 = mp_decode_array(&local_c0);
  _ok((uint)(uVar1 == 0xfffffffe),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
  _ok((uint)((long)d2_7 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "len(mp_encode_array(0xfffffffeU)");
  _ok((uint)(d2_7 == local_c0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "len(mp_decode_array(0xfffffffeU))");
  uVar1 = mp_sizeof_array(0xfffffffe);
  _ok((uint)(uVar1 == 5),"mp_sizeof_array(0xfffffffeU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "mp_sizeof_array(0xfffffffeU)");
  iVar2 = memcmp(data,anon_var_dwarf_6c9b,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdd\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",400,
      "mp_encode(0xfffffffeU) == \"\\xdd\\xff\\xff\\xff\\xfe\"");
  d2_8 = mp_encode_array(data,0xffffffff);
  local_d8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array 0xffffffffU");
  sz._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_array(data,d2_8);
  _ok((uint)(pVar3 == 0),"mp_check_array(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "mp_check_array(0xffffffffU) == 0");
  uVar1 = mp_decode_array(&local_d8);
  _ok((uint)(uVar1 == 0xffffffff),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
  _ok((uint)((long)d2_8 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "len(mp_encode_array(0xffffffffU)");
  _ok((uint)(d2_8 == local_d8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "len(mp_decode_array(0xffffffffU))");
  uVar1 = mp_sizeof_array(0xffffffff);
  _ok((uint)(uVar1 == 5),"mp_sizeof_array(0xffffffffU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "mp_sizeof_array(0xffffffffU)");
  iVar2 = memcmp(data,anon_var_dwarf_6d13,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdd\\xff\\xff\\xff\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x191,
      "mp_encode(0xffffffffU) == \"\\xdd\\xff\\xff\\xff\\xff\"");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"array_safe");
  sz._0_4_ = fprintf(_stdout,"\n");
  d = (char *)0x0;
  pcVar4 = mp_encode_array_safe((char *)0x0,(ptrdiff_t *)&d,0xffff);
  _ok((uint)(d == (char *)0xfffffffffffffffd),"-sz == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "size after mp_encode_array_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "mp_encode_array_safe(NULL, &sz)");
  d = (char *)0x3;
  pcVar4 = mp_encode_array_safe(data,(ptrdiff_t *)&d,0xffff);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "size after mp_encode_array_safe(buf, &sz)");
  _ok((uint)((long)pcVar4 - (long)data == 3),"(d - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "len of mp_encode_array_safe(buf, &sz)");
  iVar2 = memcmp(data,anon_var_dwarf_6b9f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "mp_encode_array_safe(buf, &sz)");
  d = (char *)0x2;
  pcVar4 = mp_encode_array_safe(data,(ptrdiff_t *)&d,0xffff);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "size after mp_encode_array_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "mp_encode_array_safe(buf, &sz) overflow");
  pcVar4 = mp_encode_array_safe(data,(ptrdiff_t *)0x0,0xffff);
  _ok((uint)((long)pcVar4 - (long)data == 3),"(d - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "len of mp_encode_array_safe(buf, NULL)");
  iVar2 = memcmp(data,anon_var_dwarf_6b9f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x193,
      "mp_encode_array_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_arrays");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

static int
test_arrays(void)
{
	plan(9*6 + 9);
	header();

	test_array(0, "\x90", 1);
	test_array(1, "\x91", 1);
	test_array(15, "\x9f", 1);
	test_array(16, "\xdc\x00\x10", 3);
	test_array(0xfffe, "\xdc\xff\xfe", 3);
	test_array(0xffff, "\xdc\xff\xff", 3);
	test_array(0x10000, "\xdd\x00\x01\x00\x00", 5);
	test_array(0xfffffffeU, "\xdd\xff\xff\xff\xfe", 5);
	test_array(0xffffffffU, "\xdd\xff\xff\xff\xff", 5);

	test_array_safe(0xffff, "\xdc\xff\xff", 3);

	footer();
	return check_plan();
}